

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void hmac_apply_key(st_picotls_hmac_context_t *ctx,uint8_t pad)

{
  size_t local_20;
  size_t i;
  uint8_t pad_local;
  st_picotls_hmac_context_t *ctx_local;
  
  for (local_20 = 0; local_20 != ctx->algo->block_size; local_20 = local_20 + 1) {
    ctx->key[local_20] = ctx->key[local_20] ^ pad;
  }
  (*ctx->hash->update)(ctx->hash,ctx->key,ctx->algo->block_size);
  for (local_20 = 0; local_20 != ctx->algo->block_size; local_20 = local_20 + 1) {
    ctx->key[local_20] = ctx->key[local_20] ^ pad;
  }
  return;
}

Assistant:

static void hmac_apply_key(struct st_picotls_hmac_context_t *ctx, uint8_t pad)
{
    size_t i;

    for (i = 0; i != ctx->algo->block_size; ++i)
        ctx->key[i] ^= pad;
    ctx->hash->update(ctx->hash, ctx->key, ctx->algo->block_size);
    for (i = 0; i != ctx->algo->block_size; ++i)
        ctx->key[i] ^= pad;
}